

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QListViewItem>::emplace<QListViewItem_const&>
          (QPodArrayOps<QListViewItem> *this,qsizetype i,QListViewItem *args)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  qsizetype qVar6;
  QListViewItem *pQVar7;
  undefined8 *in_RDX;
  QArrayDataPointer<QListViewItem> *in_RSI;
  QArrayDataPointer<QListViewItem> *in_RDI;
  long in_FS_OFFSET;
  QListViewItem *where;
  GrowthPosition pos;
  bool detach;
  QListViewItem tmp;
  QArrayDataPointer<QListViewItem> *in_stack_ffffffffffffffb8;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar9;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = QArrayDataPointer<QListViewItem>::needsDetach(in_RDI);
  uVar9 = CONCAT13(bVar5,(int3)in_stack_ffffffffffffffc4);
  if (!bVar5) {
    if ((in_RSI == (QArrayDataPointer<QListViewItem> *)in_RDI->size) &&
       (qVar6 = QArrayDataPointer<QListViewItem>::freeSpaceAtEnd(in_stack_ffffffffffffffb8),
       qVar6 != 0)) {
      pQVar7 = QArrayDataPointer<QListViewItem>::end(in_RDI);
      uVar3 = *in_RDX;
      pQVar7->x = (int)uVar3;
      pQVar7->y = (int)((ulong)uVar3 >> 0x20);
      uVar3 = in_RDX[1];
      pQVar7->w = (short)uVar3;
      pQVar7->h = (short)((ulong)uVar3 >> 0x10);
      pQVar7->indexHint = (int)((ulong)uVar3 >> 0x20);
      pQVar7->visited = *(uint *)(in_RDX + 2);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00898c7c;
    }
    if ((in_RSI == (QArrayDataPointer<QListViewItem> *)0x0) &&
       (qVar6 = QArrayDataPointer<QListViewItem>::freeSpaceAtBegin(in_stack_ffffffffffffffb8),
       qVar6 != 0)) {
      pQVar7 = QArrayDataPointer<QListViewItem>::begin((QArrayDataPointer<QListViewItem> *)0x898b83)
      ;
      uVar3 = *in_RDX;
      pQVar7[-1].x = (int)uVar3;
      pQVar7[-1].y = (int)((ulong)uVar3 >> 0x20);
      uVar3 = in_RDX[1];
      pQVar7[-1].w = (short)uVar3;
      pQVar7[-1].h = (short)((ulong)uVar3 >> 0x10);
      pQVar7[-1].indexHint = (int)((ulong)uVar3 >> 0x20);
      pQVar7[-1].visited = *(uint *)(in_RDX + 2);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00898c7c;
    }
  }
  uVar3 = *in_RDX;
  uVar4 = in_RDX[1];
  uVar1 = *(uint *)(in_RDX + 2);
  uVar8 = 0;
  if ((in_RDI->size != 0) && (in_RSI == (QArrayDataPointer<QListViewItem> *)0x0)) {
    uVar8 = 1;
  }
  QArrayDataPointer<QListViewItem>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(uVar9,uVar8),
             (QListViewItem **)in_stack_ffffffffffffffb8,in_RDI);
  pQVar7 = createHole((QPodArrayOps<QListViewItem> *)in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
                      CONCAT44(uVar9,uVar8),(qsizetype)in_stack_ffffffffffffffb8);
  pQVar7->x = (int)uVar3;
  pQVar7->y = (int)((ulong)uVar3 >> 0x20);
  pQVar7->w = (short)uVar4;
  pQVar7->h = (short)((ulong)uVar4 >> 0x10);
  pQVar7->indexHint = (int)((ulong)uVar4 >> 0x20);
  pQVar7->visited = uVar1;
LAB_00898c7c:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }